

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image-write.h
# Opt level: O3

uchar * stbi_write_png_to_mem(uchar *pixels,int stride_bytes,int x,int y,int n,int *out_len)

{
  int *piVar1;
  int *piVar2;
  byte *pbVar3;
  void **arr;
  byte bVar4;
  long lVar5;
  bool bVar6;
  undefined1 uVar7;
  int iVar8;
  uint uVar9;
  void *__ptr;
  void *pvVar10;
  undefined8 *puVar11;
  uchar *puVar12;
  uchar *puVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  int itemsize;
  int itemsize_00;
  int extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar17;
  ulong extraout_RDX_02;
  undefined2 uVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  int best_filter_val;
  int iVar22;
  int iVar23;
  byte bVar24;
  uint uVar25;
  undefined4 in_register_00000084;
  long lVar26;
  long lVar27;
  ulong uVar28;
  uint uVar29;
  uint itemsize_01;
  size_t __n;
  int in_stack_ffffffffffffff68;
  uint local_94;
  uchar *in_stack_ffffffffffffff70;
  uchar *puVar30;
  ulong local_80;
  
  uVar19 = x * 4;
  if (stride_bytes == 0) {
    stride_bytes = uVar19;
  }
  iVar22 = x * 4 + 1;
  uVar29 = iVar22 * y;
  __ptr = malloc((long)(int)uVar29);
  if (__ptr == (void *)0x0) {
    return (uchar *)0x0;
  }
  pvVar10 = malloc((long)(int)uVar19);
  if (pvVar10 == (void *)0x0) {
LAB_0011848b:
    free(__ptr);
    return (uchar *)0x0;
  }
  if (0 < y) {
    uVar28 = 1;
    if (1 < (int)uVar19) {
      uVar28 = (ulong)uVar19;
    }
    local_80 = 0;
    do {
      iVar14 = 0x7fffffff;
      iVar23 = 0;
      iVar20 = 0;
      do {
        stbiw__encode_png_line
                  (pixels,stride_bytes,x,(int)local_80,iVar20,(int)pvVar10,in_stack_ffffffffffffff68
                   ,(char *)in_stack_ffffffffffffff70);
        if (x < 1) {
          iVar8 = 0;
        }
        else {
          uVar15 = 0;
          iVar8 = 0;
          do {
            bVar24 = (char)*(byte *)((long)pvVar10 + uVar15) >> 7;
            iVar8 = iVar8 + (uint)(byte)((*(byte *)((long)pvVar10 + uVar15) ^ bVar24) - bVar24);
            uVar15 = uVar15 + 1;
          } while (uVar28 != uVar15);
        }
        if (iVar8 < iVar14) {
          iVar14 = iVar8;
          iVar23 = iVar20;
        }
        iVar20 = iVar20 + 1;
      } while (iVar20 != 5);
      uVar7 = 5;
      if (iVar23 != 5) {
        stbiw__encode_png_line
                  (pixels,stride_bytes,x,(int)local_80,iVar23,(int)pvVar10,in_stack_ffffffffffffff68
                   ,(char *)in_stack_ffffffffffffff70);
        uVar7 = (undefined1)iVar23;
      }
      lVar16 = local_80 * (long)iVar22;
      *(undefined1 *)((long)__ptr + lVar16) = uVar7;
      memcpy((void *)((long)__ptr + lVar16 + 1),pvVar10,(long)(int)uVar19);
      local_80 = local_80 + 1;
    } while (local_80 != (uint)y);
  }
  free(pvVar10);
  puVar30 = (uchar *)0x0;
  pvVar10 = malloc(0x20000);
  if (pvVar10 == (void *)0x0) goto LAB_0011848b;
  stbiw__sbgrowf((void **)&stack0xffffffffffffff70,1,itemsize);
  iVar22 = *(int *)(puVar30 + -4);
  *(int *)(puVar30 + -4) = iVar22 + 1;
  puVar30[iVar22] = 'x';
  iVar23 = *(int *)(puVar30 + -4);
  iVar22 = iVar23 + 1;
  if (*(int *)(puVar30 + -8) <= iVar22) {
    stbiw__sbgrowf((void **)&stack0xffffffffffffff70,1,itemsize_00);
    iVar23 = *(int *)(puVar30 + -4);
    iVar22 = iVar23 + 1;
  }
  *(int *)(puVar30 + -4) = iVar22;
  puVar30[iVar23] = '^';
  local_94 = 1;
  iVar22 = 1;
  puVar30 = stbiw__zlib_flushf(puVar30,&local_94,(int *)&stack0xffffffffffffff68);
  local_94 = local_94 | 1 << ((byte)iVar22 & 0x1f);
  iVar22 = iVar22 + 2;
  puVar30 = stbiw__zlib_flushf(puVar30,&local_94,(int *)&stack0xffffffffffffff68);
  uVar19 = 0;
  memset(pvVar10,0,0x20000);
  if (3 < (int)uVar29) {
    uVar19 = 0;
    uVar17 = extraout_RDX;
    do {
      iVar23 = (int)uVar17;
      lVar16 = (long)(int)uVar19;
      pbVar3 = (byte *)((long)__ptr + lVar16);
      uVar9 = (uint)CONCAT12(*(undefined1 *)((long)__ptr + lVar16 + 2),
                             *(undefined2 *)((long)__ptr + lVar16));
      uVar9 = uVar9 * 8 ^ uVar9;
      uVar9 = (uVar9 >> 5) + uVar9;
      uVar9 = uVar9 * 0x10 ^ uVar9;
      uVar9 = (uVar9 >> 0x11) + uVar9;
      uVar28 = (ulong)((uVar9 >> 6) + uVar9 & 0x3fff);
      puVar11 = *(undefined8 **)((long)pvVar10 + uVar28 * 8);
      if (puVar11 == (undefined8 *)0x0) {
        iVar14 = 3;
        lVar16 = 0;
LAB_00118176:
        arr = (void **)((long)pvVar10 + uVar28 * 8);
        stbiw__sbgrowf(arr,8,iVar23);
        puVar11 = (undefined8 *)*arr;
        iVar23 = *(int *)((long)puVar11 + -4);
        iVar20 = iVar23 + 1;
      }
      else {
        iVar23 = *(int *)((long)puVar11 + -4);
        if ((long)iVar23 < 1) {
          iVar14 = 3;
          lVar16 = 0;
        }
        else {
          uVar9 = (uVar29 - uVar19) - 1;
          if (0x100 < uVar9) {
            uVar9 = 0x101;
          }
          iVar14 = 3;
          lVar26 = 0;
          lVar16 = 0;
          do {
            lVar27 = puVar11[lVar26];
            if ((long)(int)(uVar19 - 0x8000) < lVar27 - (long)__ptr) {
              uVar15 = 0;
              if (0 < (int)(uVar29 - uVar19)) {
                do {
                  if (*(byte *)(lVar27 + uVar15) != pbVar3[uVar15]) goto LAB_00118115;
                  uVar15 = uVar15 + 1;
                } while (uVar9 + 1 != uVar15);
                uVar15 = (ulong)(uVar9 + 1);
              }
LAB_00118115:
              iVar8 = (int)uVar15;
              iVar20 = iVar14;
              if (iVar14 < iVar8) {
                iVar20 = iVar8;
              }
              bVar6 = iVar14 <= iVar8;
              iVar14 = iVar20;
              if (bVar6) {
                lVar16 = lVar27;
              }
            }
            lVar26 = lVar26 + 1;
          } while (lVar26 != iVar23);
          if (iVar23 == 0x10) {
            puVar11[6] = puVar11[0xe];
            puVar11[7] = puVar11[0xf];
            puVar11[4] = puVar11[0xc];
            puVar11[5] = puVar11[0xd];
            puVar11[2] = puVar11[10];
            puVar11[3] = puVar11[0xb];
            *puVar11 = puVar11[8];
            puVar11[1] = puVar11[9];
            *(undefined4 *)((long)puVar11 + -4) = 8;
            iVar23 = 8;
          }
        }
        iVar20 = iVar23 + 1;
        if (*(int *)(puVar11 + -1) <= iVar20) goto LAB_00118176;
      }
      *(int *)((long)puVar11 + -4) = iVar20;
      puVar11[iVar23] = pbVar3;
      bVar24 = (byte)iVar22;
      if (lVar16 == 0) {
LAB_001182ce:
        bVar4 = *pbVar3;
        if (bVar4 < 0x90) {
          uVar9 = bVar4 + 0x30;
          iVar23 = 0;
          iVar14 = -8;
          do {
            iVar23 = (uVar9 & 1) + iVar23 * 2;
            uVar9 = uVar9 >> 1;
            iVar14 = iVar14 + 1;
          } while (iVar14 != 0);
          uVar9 = iVar23 << (bVar24 & 0x1f);
          iVar22 = iVar22 + 8;
        }
        else {
          uVar9 = bVar4 | 0x100;
          iVar23 = 0;
          iVar14 = -9;
          do {
            iVar23 = (uVar9 & 1) + iVar23 * 2;
            uVar9 = uVar9 >> 1;
            iVar14 = iVar14 + 1;
          } while (iVar14 != 0);
          uVar9 = iVar23 << (bVar24 & 0x1f);
          iVar22 = iVar22 + 9;
        }
        local_94 = local_94 | uVar9;
        iVar14 = 1;
LAB_0011846e:
        puVar30 = stbiw__zlib_flushf(puVar30,&local_94,(int *)&stack0xffffffffffffff68);
        uVar17 = extraout_RDX_01;
      }
      else {
        uVar9 = (uint)*(uint3 *)(pbVar3 + 1) * 8 ^ (uint)*(uint3 *)(pbVar3 + 1);
        uVar9 = (uVar9 >> 5) + uVar9;
        uVar9 = uVar9 * 0x10 ^ uVar9;
        uVar9 = (uVar9 >> 0x11) + uVar9;
        lVar26 = *(long *)((long)pvVar10 + (ulong)((uVar9 >> 6) + uVar9 & 0x3fff) * 8);
        if ((lVar26 != 0) && (0 < (long)*(int *)(lVar26 + -4))) {
          uVar9 = (~uVar19 + uVar29) - 1;
          if (0x100 < uVar9) {
            uVar9 = 0x101;
          }
          lVar27 = 0;
          do {
            lVar5 = *(long *)(lVar26 + lVar27 * 8);
            if ((long)(int)(uVar19 - 0x7fff) < lVar5 - (long)__ptr) {
              uVar28 = 0;
              iVar23 = 0;
              if (0 < (int)(uVar29 + ~uVar19)) {
                do {
                  if (*(byte *)(lVar5 + uVar28) != pbVar3[uVar28 + 1]) goto LAB_0011825e;
                  uVar28 = uVar28 + 1;
                } while (uVar9 + 1 != uVar28);
                uVar28 = (ulong)(uVar9 + 1);
LAB_0011825e:
                iVar23 = (int)uVar28;
              }
              if (iVar14 < iVar23) goto LAB_001182ce;
            }
            lVar27 = lVar27 + 1;
          } while (lVar27 != *(int *)(lVar26 + -4));
        }
        iVar23 = (int)pbVar3 - (int)lVar16;
        if ((0x7fff < iVar23) || (0x102 < iVar14)) {
          __assert_fail("d <= 32767 && best <= 258",
                        "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-image-write.h"
                        ,0x3bf,"unsigned char *stbi_zlib_compress(unsigned char *, int, int *, int)"
                       );
        }
        uVar28 = 0;
        do {
          uVar15 = uVar28;
          uVar28 = uVar15 + 1;
        } while ((int)(uint)*(ushort *)(stbi_zlib_compress_lengthc + uVar15 * 2 + 2) <= iVar14);
        if (uVar15 < 0x17) {
          iVar20 = 0;
          iVar8 = -7;
          do {
            iVar20 = ((uint)uVar28 & 1) + iVar20 * 2;
            uVar28 = (ulong)((uint)uVar28 >> 1);
            iVar8 = iVar8 + 1;
          } while (iVar8 != 0);
          uVar9 = iVar20 << (bVar24 & 0x1f);
          iVar22 = iVar22 + 7;
        }
        else {
          uVar9 = (int)uVar28 + 0xa8;
          iVar20 = 0;
          iVar8 = -8;
          do {
            iVar20 = (uVar9 & 1) + iVar20 * 2;
            uVar9 = uVar9 >> 1;
            iVar8 = iVar8 + 1;
          } while (iVar8 != 0);
          uVar9 = iVar20 << (bVar24 & 0x1f);
          iVar22 = iVar22 + 8;
        }
        local_94 = local_94 | uVar9;
        puVar30 = stbiw__zlib_flushf(puVar30,&local_94,(int *)&stack0xffffffffffffff68);
        uVar15 = uVar15 & 0xffffffff;
        if (0xffffffffffffffeb < uVar15 - 0x1c) {
          local_94 = local_94 |
                     iVar14 - (uint)*(ushort *)(stbi_zlib_compress_lengthc + uVar15 * 2) <<
                     ((byte)iVar22 & 0x1f);
          iVar22 = (uint)(byte)stbi_zlib_compress_lengtheb[uVar15] + iVar22;
          puVar30 = stbiw__zlib_flushf(puVar30,&local_94,(int *)&stack0xffffffffffffff68);
        }
        uVar28 = 0xffffffffffffffff;
        do {
          lVar16 = uVar28 * 2;
          uVar28 = uVar28 + 1;
        } while ((int)(uint)*(ushort *)(stbi_zlib_compress_distc + lVar16 + 4) <= iVar23);
        iVar20 = 0;
        iVar8 = -5;
        uVar15 = uVar28 & 0xffffffff;
        do {
          iVar20 = ((uint)uVar15 & 1) + iVar20 * 2;
          uVar15 = uVar15 >> 1;
          iVar8 = iVar8 + 1;
        } while (iVar8 != 0);
        local_94 = local_94 | iVar20 << ((byte)iVar22 & 0x1f);
        iVar22 = iVar22 + 5;
        puVar30 = stbiw__zlib_flushf(puVar30,&local_94,(int *)&stack0xffffffffffffff68);
        uVar17 = extraout_RDX_00;
        if (3 < uVar28) {
          local_94 = local_94 |
                     iVar23 - (uint)*(ushort *)
                                     (stbi_zlib_compress_distc + (uVar28 & 0xffffffff) * 2) <<
                     ((byte)iVar22 & 0x1f);
          iVar22 = (uint)(byte)stbi_zlib_compress_disteb[uVar28 & 0xffffffff] + iVar22;
          goto LAB_0011846e;
        }
      }
      uVar19 = iVar14 + uVar19;
    } while ((int)uVar19 < (int)(uVar29 - 3));
  }
  if ((int)uVar19 < (int)uVar29) {
    lVar16 = (long)(int)uVar19;
    do {
      bVar24 = *(byte *)((long)__ptr + lVar16);
      if (bVar24 < 0x90) {
        uVar19 = bVar24 + 0x30;
        iVar23 = 0;
        iVar14 = -8;
        do {
          iVar23 = (uVar19 & 1) + iVar23 * 2;
          uVar19 = uVar19 >> 1;
          iVar14 = iVar14 + 1;
        } while (iVar14 != 0);
        uVar19 = iVar23 << ((byte)iVar22 & 0x1f);
        iVar22 = iVar22 + 8;
      }
      else {
        uVar19 = bVar24 | 0x100;
        iVar23 = 0;
        iVar14 = -9;
        do {
          iVar23 = (uVar19 & 1) + iVar23 * 2;
          uVar19 = uVar19 >> 1;
          iVar14 = iVar14 + 1;
        } while (iVar14 != 0);
        uVar19 = iVar23 << ((byte)iVar22 & 0x1f);
        iVar22 = iVar22 + 9;
      }
      local_94 = local_94 | uVar19;
      puVar30 = stbiw__zlib_flushf(puVar30,&local_94,(int *)&stack0xffffffffffffff68);
      lVar16 = lVar16 + 1;
    } while (uVar29 != (uint)lVar16);
  }
  iVar22 = iVar22 + 7;
  puVar30 = stbiw__zlib_flushf(puVar30,&local_94,(int *)&stack0xffffffffffffff68);
  if (iVar22 != 0) {
    do {
      iVar22 = iVar22 + 1;
      puVar30 = stbiw__zlib_flushf(puVar30,&local_94,(int *)&stack0xffffffffffffff68);
    } while (iVar22 != 0);
  }
  lVar16 = 0;
  puVar12 = puVar30;
  do {
    lVar26 = *(long *)((long)pvVar10 + lVar16 * 8);
    if (lVar26 != 0) {
      free((void *)(lVar26 + -8));
    }
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x4000);
  free(pvVar10);
  iVar22 = *(int *)(puVar30 + -4);
  iVar23 = (int)((ulong)((long)(int)(uVar29 + 0x7ffe) * -0x7ffefffd) >> 0x20) + uVar29 + 0x7ffe;
  uVar19 = -(iVar23 >> 0x1f);
  uVar28 = (ulong)uVar19;
  if ((int)(((iVar23 >> 0xe) + uVar19) * 5 + uVar29 + 2) < iVar22) {
    puVar30[-4] = '\x02';
    puVar30[-3] = '\0';
    puVar30[-2] = '\0';
    puVar30[-1] = '\0';
    if (0 < (int)uVar29) {
      iVar23 = 0;
      iVar22 = 2;
      do {
        iVar14 = (int)uVar28;
        uVar19 = uVar29 - iVar23;
        uVar9 = 0x7fff;
        if ((int)uVar19 < 0x7fff) {
          uVar9 = uVar19;
        }
        iVar20 = iVar22 + 1;
        if (*(int *)(puVar30 + -8) <= iVar20) {
          puVar30 = puVar12;
          stbiw__sbgrowf((void **)&stack0xffffffffffffff70,1,iVar14);
          iVar22 = *(int *)(puVar30 + -4);
          iVar20 = iVar22 + 1;
          iVar14 = extraout_EDX;
          puVar12 = puVar30;
        }
        *(int *)(puVar30 + -4) = iVar20;
        puVar30[iVar22] = (int)uVar19 < 0x8000;
        piVar1 = (int *)(puVar30 + -4);
        piVar2 = (int *)(puVar30 + -8);
        puVar30 = puVar12;
        if (*piVar2 <= *piVar1 + 1) {
          stbiw__sbgrowf((void **)&stack0xffffffffffffff70,1,iVar14);
          puVar30 = puVar12;
        }
        iVar22 = *(int *)(puVar30 + -4);
        *(int *)(puVar30 + -4) = iVar22 + 1;
        puVar30[iVar22] = (uchar)uVar9;
        iVar14 = *(int *)(puVar30 + -4);
        iVar22 = iVar14 + 1;
        if (*(int *)(puVar30 + -8) <= iVar22) {
          stbiw__sbgrowf((void **)&stack0xffffffffffffff70,1,iVar22);
          iVar14 = *(int *)(puVar30 + -4);
          iVar22 = iVar14 + 1;
        }
        *(int *)(puVar30 + -4) = iVar22;
        puVar30[iVar14] = (uchar)(uVar9 >> 8);
        iVar14 = *(int *)(puVar30 + -4);
        iVar22 = iVar14 + 1;
        if (*(int *)(puVar30 + -8) <= iVar22) {
          stbiw__sbgrowf((void **)&stack0xffffffffffffff70,1,iVar22);
          iVar14 = *(int *)(puVar30 + -4);
          iVar22 = iVar14 + 1;
        }
        *(int *)(puVar30 + -4) = iVar22;
        puVar30[iVar14] = (uchar)~uVar9;
        if (*(int *)(puVar30 + -8) <= *(int *)(puVar30 + -4) + 1) {
          stbiw__sbgrowf((void **)&stack0xffffffffffffff70,1,iVar22);
        }
        iVar22 = *(int *)(puVar30 + -4);
        *(int *)(puVar30 + -4) = iVar22 + 1;
        puVar30[iVar22] = (uchar)(~uVar9 >> 8);
        puVar12 = puVar30;
        memcpy(puVar30 + *(int *)(puVar30 + -4),(void *)((long)iVar23 + (long)__ptr),
               (long)(int)uVar9);
        uVar19 = (uint)extraout_RDX_02;
        iVar22 = *(int *)(puVar30 + -4) + uVar9;
        *(int *)(puVar30 + -4) = iVar22;
        iVar23 = iVar23 + uVar9;
        uVar28 = extraout_RDX_02;
      } while (iVar23 < (int)uVar29);
      goto LAB_00118733;
    }
    iVar22 = 2;
LAB_001187c6:
    itemsize_01 = 1;
    uVar21 = 0;
LAB_001187ce:
    uVar9 = uVar19;
    uVar18 = (undefined2)uVar21;
    iVar23 = iVar22 + 1;
    if (iVar23 < *(int *)(puVar30 + -8)) goto LAB_001187f1;
  }
  else {
LAB_00118733:
    if ((int)uVar29 < 1) goto LAB_001187c6;
    uVar19 = uVar29 % 0x15b0;
    itemsize_01 = 1;
    uVar21 = 0;
    uVar9 = 0x80078071;
    uVar28 = 0;
    do {
      if (uVar19 != 0) {
        uVar15 = 0;
        do {
          itemsize_01 = itemsize_01 + *(byte *)((long)__ptr + uVar15 + uVar28);
          uVar21 = uVar21 + itemsize_01;
          uVar15 = uVar15 + 1;
        } while (uVar19 != uVar15);
        itemsize_01 = itemsize_01 % 0xfff1;
        uVar21 = uVar21 % 0xfff1;
      }
      uVar25 = (int)uVar28 + uVar19;
      uVar28 = (ulong)uVar25;
      uVar19 = 0x15b0;
    } while ((int)uVar25 < (int)uVar29);
    uVar19 = 0x80078071;
    if (puVar30 != (uchar *)0x0) goto LAB_001187ce;
  }
  puVar30 = puVar12;
  uVar18 = (undefined2)uVar21;
  stbiw__sbgrowf((void **)&stack0xffffffffffffff70,1,uVar9);
  iVar22 = *(int *)(puVar30 + -4);
  iVar23 = iVar22 + 1;
  uVar9 = extraout_EDX_00;
  puVar12 = puVar30;
LAB_001187f1:
  *(int *)(puVar30 + -4) = iVar23;
  puVar30[iVar22] = (uchar)((ushort)uVar18 >> 8);
  if (*(int *)(puVar30 + -8) <= *(int *)(puVar30 + -4) + 1) {
    stbiw__sbgrowf((void **)&stack0xffffffffffffff70,1,uVar9);
    uVar9 = extraout_EDX_01;
  }
  iVar22 = *(int *)(puVar12 + -4);
  *(int *)(puVar12 + -4) = iVar22 + 1;
  puVar12[iVar22] = (uchar)uVar18;
  iVar23 = *(int *)(puVar12 + -4);
  iVar22 = iVar23 + 1;
  if (*(int *)(puVar12 + -8) <= iVar22) {
    stbiw__sbgrowf((void **)&stack0xffffffffffffff70,1,uVar9);
    iVar23 = *(int *)(puVar12 + -4);
    iVar22 = iVar23 + 1;
  }
  *(int *)(puVar12 + -4) = iVar22;
  puVar12[iVar23] = (uchar)(itemsize_01 >> 8);
  iVar23 = *(int *)(puVar12 + -4);
  iVar22 = iVar23 + 1;
  if (*(int *)(puVar12 + -8) <= iVar22) {
    stbiw__sbgrowf((void **)&stack0xffffffffffffff70,1,itemsize_01);
    iVar23 = *(int *)(puVar12 + -4);
    iVar22 = iVar23 + 1;
  }
  *(int *)(puVar12 + -4) = iVar22;
  puVar12[iVar23] = (uchar)itemsize_01;
  iVar22 = *(int *)(puVar12 + -4);
  __n = (size_t)iVar22;
  puVar30 = puVar12 + -8;
  memmove(puVar30,puVar12,__n);
  free(__ptr);
  puVar12 = (uchar *)malloc(__n + 0x39);
  if (puVar12 == (uchar *)0x0) {
    return (uchar *)0x0;
  }
  *(int *)CONCAT44(in_register_00000084,n) = (int)(__n + 0x39);
  puVar12[0] = 0x89;
  puVar12[1] = 'P';
  puVar12[2] = 'N';
  puVar12[3] = 'G';
  puVar12[4] = '\r';
  puVar12[5] = '\n';
  puVar12[6] = '\x1a';
  puVar12[7] = '\n';
  puVar12[8] = '\0';
  puVar12[9] = '\0';
  puVar12[10] = '\0';
  puVar12[0xb] = '\r';
  puVar12[0xc] = 'I';
  puVar12[0xd] = 'H';
  puVar12[0xe] = 'D';
  puVar12[0xf] = 'R';
  puVar12[0x10] = (uchar)((uint)x >> 0x18);
  puVar12[0x11] = (uchar)((uint)x >> 0x10);
  puVar12[0x12] = (uchar)((uint)x >> 8);
  puVar12[0x13] = (uchar)x;
  puVar12[0x14] = (uchar)((uint)y >> 0x18);
  puVar12[0x15] = (uchar)((uint)y >> 0x10);
  puVar12[0x16] = (uchar)((uint)y >> 8);
  puVar12[0x17] = (uchar)y;
  puVar12[0x18] = '\b';
  puVar12[0x19] = '\x06';
  puVar12[0x1a] = '\0';
  puVar12[0x1b] = '\0';
  puVar13 = puVar12 + 0x1d;
  puVar12[0x1c] = '\0';
  stbiw__wpcrc((uchar **)&stack0xffffffffffffff70,0xd);
  *puVar13 = (uchar)((uint)iVar22 >> 0x18);
  puVar13[1] = (uchar)((uint)iVar22 >> 0x10);
  puVar13[2] = (uchar)((uint)iVar22 >> 8);
  puVar13[3] = (uchar)iVar22;
  puVar13[4] = 'I';
  puVar13[5] = 'D';
  puVar13[6] = 'A';
  puVar13[7] = 'T';
  memmove(puVar13 + 8,puVar30,__n);
  puVar13 = puVar13 + __n + 8;
  free(puVar30);
  stbiw__wpcrc((uchar **)&stack0xffffffffffffff70,iVar22);
  puVar13[0] = '\0';
  puVar13[1] = '\0';
  puVar13[2] = '\0';
  puVar13[3] = '\0';
  puVar13[4] = 'I';
  puVar13[5] = 'E';
  puVar13[6] = 'N';
  puVar13[7] = 'D';
  puVar13 = puVar13 + 8;
  stbiw__wpcrc((uchar **)&stack0xffffffffffffff70,0);
  if (puVar13 != puVar12 + *(int *)CONCAT44(in_register_00000084,n)) {
    __assert_fail("o == out + *out_len",
                  "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-image-write.h"
                  ,0x4b9,
                  "unsigned char *stbi_write_png_to_mem(const unsigned char *, int, int, int, int, int *)"
                 );
  }
  return puVar12;
}

Assistant:

STBIWDEF unsigned char *stbi_write_png_to_mem(const unsigned char *pixels, int stride_bytes, int x, int y, int n, int *out_len)
{
   int force_filter = stbi_write_force_png_filter;
   int ctype[5] = { -1, 0, 4, 2, 6 };
   unsigned char sig[8] = { 137,80,78,71,13,10,26,10 };
   unsigned char *out,*o, *filt, *zlib;
   signed char *line_buffer;
   int j,zlen;

   if (stride_bytes == 0)
      stride_bytes = x * n;

   if (force_filter >= 5) {
      force_filter = -1;
   }

   filt = (unsigned char *) STBIW_MALLOC((x*n+1) * y); if (!filt) return 0;
   line_buffer = (signed char *) STBIW_MALLOC(x * n); if (!line_buffer) { STBIW_FREE(filt); return 0; }
   for (j=0; j < y; ++j) {
      int filter_type;
      if (force_filter > -1) {
         filter_type = force_filter;
         stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, force_filter, line_buffer);
      } else { // Estimate the best filter by running through all of them:
         int best_filter = 0, best_filter_val = 0x7fffffff, est, i;
         for (filter_type = 0; filter_type < 5; filter_type++) {
            stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, filter_type, line_buffer);

            // Estimate the entropy of the line using this filter; the less, the better.
            est = 0;
            for (i = 0; i < x*n; ++i) {
               est += abs((signed char) line_buffer[i]);
            }
            if (est < best_filter_val) {
               best_filter_val = est;
               best_filter = filter_type;
            }
         }
         if (filter_type != best_filter) {  // If the last iteration already got us the best filter, don't redo it
            stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, best_filter, line_buffer);
            filter_type = best_filter;
         }
      }
      // when we get here, filter_type contains the filter type, and line_buffer contains the data
      filt[j*(x*n+1)] = (unsigned char) filter_type;
      STBIW_MEMMOVE(filt+j*(x*n+1)+1, line_buffer, x*n);
   }
   STBIW_FREE(line_buffer);
   zlib = stbi_zlib_compress(filt, y*( x*n+1), &zlen, stbi_write_png_compression_level);
   STBIW_FREE(filt);
   if (!zlib) return 0;

   // each tag requires 12 bytes of overhead
   out = (unsigned char *) STBIW_MALLOC(8 + 12+13 + 12+zlen + 12);
   if (!out) return 0;
   *out_len = 8 + 12+13 + 12+zlen + 12;

   o=out;
   STBIW_MEMMOVE(o,sig,8); o+= 8;
   stbiw__wp32(o, 13); // header length
   stbiw__wptag(o, "IHDR");
   stbiw__wp32(o, x);
   stbiw__wp32(o, y);
   *o++ = 8;
   *o++ = STBIW_UCHAR(ctype[n]);
   *o++ = 0;
   *o++ = 0;
   *o++ = 0;
   stbiw__wpcrc(&o,13);

   stbiw__wp32(o, zlen);
   stbiw__wptag(o, "IDAT");
   STBIW_MEMMOVE(o, zlib, zlen);
   o += zlen;
   STBIW_FREE(zlib);
   stbiw__wpcrc(&o, zlen);

   stbiw__wp32(o,0);
   stbiw__wptag(o, "IEND");
   stbiw__wpcrc(&o,0);

   STBIW_ASSERT(o == out + *out_len);

   return out;
}